

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod.c
# Opt level: O1

int acmod_set_insenfh(acmod_t *acmod,FILE *senfh)

{
  int32 iVar1;
  int iVar2;
  uint uVar3;
  char *__s1;
  long lVar4;
  float64 fVar5;
  char **val;
  char **name;
  char **local_50;
  char **local_48;
  uint8 local_3c [4];
  double local_38;
  
  acmod->insenfh = senfh;
  if (senfh == (FILE *)0x0) {
    acmod->n_feat_frame = 0;
    iVar2 = ps_config_bool(acmod->config,"compallsen");
    acmod->compallsen = (uint8)iVar2;
  }
  else {
    acmod->compallsen = '\x01';
    iVar1 = bio_readhdr(senfh,&local_48,&local_50,(int32 *)local_3c);
    if (iVar1 < 0) {
LAB_0011bb95:
      bio_hdrarg_free(local_48,local_50);
      return -1;
    }
    __s1 = *local_48;
    if (__s1 != (char *)0x0) {
      lVar4 = 0;
      do {
        iVar2 = strcmp(__s1,"n_sen");
        if ((iVar2 == 0) &&
           (uVar3 = atoi(*(char **)((long)local_50 + lVar4)), uVar3 != acmod->mdef->n_sen)) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                  ,0x32a,"Number of senones in senone file (%d) does not match mdef (%d)\n",
                  (ulong)uVar3);
          goto LAB_0011bb95;
        }
        iVar2 = strcmp(__s1,"logbase");
        if (iVar2 == 0) {
          local_38 = atof_c(*(char **)((long)local_50 + lVar4));
          fVar5 = logmath_get_base(acmod->lmath);
          if (0.001 < ABS(local_38 - (double)fVar5)) {
            local_38 = atof_c(*(char **)((long)local_50 + lVar4));
            fVar5 = logmath_get_base(acmod->lmath);
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/acmod.c"
                    ,0x333,"Logbase in senone file (%f) does not match acmod (%f)\n",local_38,fVar5)
            ;
            goto LAB_0011bb95;
          }
        }
        __s1 = *(char **)((long)local_48 + lVar4 + 8);
        lVar4 = lVar4 + 8;
      } while (__s1 != (char *)0x0);
    }
    acmod->insen_swap = local_3c[0];
    bio_hdrarg_free(local_48,local_50);
  }
  return 0;
}

Assistant:

int
acmod_set_insenfh(acmod_t *acmod, FILE *senfh)
{
    acmod->insenfh = senfh;
    if (senfh == NULL) {
        acmod->n_feat_frame = 0;
        acmod->compallsen = ps_config_bool(acmod->config, "compallsen");
        return 0;
    }
    acmod->compallsen = TRUE;
    return acmod_read_senfh_header(acmod);
}